

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

void __thiscall TcpSocketImpl::SelectThread(TcpSocketImpl *this)

{
  atomic_uchar *paVar1;
  bool bVar2;
  int iVar3;
  BaseSocket *pBVar4;
  int32_t __n;
  pthread_mutex_t *__mutex;
  uint __i;
  int iVar5;
  __uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true> __s;
  long lVar6;
  ulong uVar7;
  ssize_t sVar8;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> __result;
  int *piVar9;
  TcpSocket *pTVar10;
  uint uVar11;
  bool bVar12;
  bool bReadCall;
  bool bZeroReceived;
  int32_t transferred;
  socklen_t iLen;
  undefined4 uStack_1cc;
  __array buf;
  thread local_1c0;
  int *local_1b8;
  function<void_(BaseSocket_*)> *local_1b0;
  function<void_(BaseSocket_*,_void_*)> *local_1a8;
  function<void_(TcpSocket_*)> *local_1a0;
  function<void_(TcpSocket_*,_void_*)> *local_198;
  deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
  *local_190;
  pthread_mutex_t *local_188;
  function<int_(const_unsigned_char_*,_unsigned_long,_bool_&)> *local_180;
  timeval local_178;
  mutex mxNotify;
  fd_set readfd;
  fd_set errorfd;
  
  LOCK();
  paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
  (paVar1->super___atomic_base<unsigned_char>)._M_i =
       (paVar1->super___atomic_base<unsigned_char>)._M_i & 0xfe;
  UNLOCK();
  bReadCall = false;
  mxNotify.super___mutex_base._M_mutex._16_8_ = 0;
  mxNotify.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  mxNotify.super___mutex_base._M_mutex.__align = 0;
  mxNotify.super___mutex_base._M_mutex._8_8_ = 0;
  mxNotify.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  __s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)operator_new__(0xffff);
  bVar12 = false;
  memset((void *)__s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl,0,0xffff);
  local_180 = &this->m_fnSslDecode;
  local_188 = (pthread_mutex_t *)&this->m_mxInDeque;
  local_190 = (deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
               *)&this->m_quInData;
  local_1a0 = &this->m_fBytesReceived;
  local_198 = &this->m_fBytesReceivedParam;
  local_1b0 = &(this->super_BaseSocketImpl).m_fError;
  local_1a8 = &(this->super_BaseSocketImpl).m_fErrorParam;
  piVar9 = &(this->super_BaseSocketImpl).m_iError;
  buf._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 __s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
LAB_00116695:
  do {
    if ((this->super_BaseSocketImpl).m_bStop != false) {
LAB_00116c88:
      if (((!bVar12) && (*piVar9 == 0)) &&
         ((iVar5 = (this->super_BaseSocketImpl).m_fSock, iVar5 != -1 &&
          (iVar5 = shutdown(iVar5,0), iVar5 != 0)))) {
        piVar9 = __errno_location();
        (this->super_BaseSocketImpl).m_iError = *piVar9;
        (this->super_BaseSocketImpl).m_iErrLoc = 8;
      }
      while (bReadCall == true) {
        readfd.fds_bits[0] = 10;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)&readfd);
      }
      std::mutex::lock(&mxNotify);
      pthread_mutex_unlock((pthread_mutex_t *)&mxNotify);
      LOCK();
      paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
      (paVar1->super___atomic_base<unsigned_char>)._M_i =
           (paVar1->super___atomic_base<unsigned_char>)._M_i | 1;
      UNLOCK();
      paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
      LOCK();
      bVar12 = (paVar1->super___atomic_base<unsigned_char>)._M_i == '\a';
      if (bVar12) {
        (paVar1->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
      if (bVar12) {
        iVar5 = (this->super_BaseSocketImpl).m_fSock;
        if (iVar5 != -1) {
          close(iVar5);
          (this->super_BaseSocketImpl).m_fSock = -1;
        }
        (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x10])(this);
        if ((this->m_pRefServSocket != (TcpServer *)0x0) || (this->m_bSelfDelete == true)) {
          (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x16])(this);
        }
      }
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&buf);
      return;
    }
    if ((this->m_atInBytes).super___atomic_base<unsigned_long>._M_i < 0x80001) {
      readfd.fds_bits[0xe] = 0;
      readfd.fds_bits[0xf] = 0;
      readfd.fds_bits[0xc] = 0;
      readfd.fds_bits[0xd] = 0;
      readfd.fds_bits[10] = 0;
      readfd.fds_bits[0xb] = 0;
      readfd.fds_bits[8] = 0;
      readfd.fds_bits[9] = 0;
      readfd.fds_bits[6] = 0;
      readfd.fds_bits[7] = 0;
      readfd.fds_bits[4] = 0;
      readfd.fds_bits[5] = 0;
      readfd.fds_bits[2] = 0;
      readfd.fds_bits[3] = 0;
      readfd.fds_bits[0] = 0;
      readfd.fds_bits[1] = 0;
      errorfd.fds_bits[0xe] = 0;
      errorfd.fds_bits[0xf] = 0;
      errorfd.fds_bits[0xc] = 0;
      errorfd.fds_bits[0xd] = 0;
      errorfd.fds_bits[10] = 0;
      errorfd.fds_bits[0xb] = 0;
      errorfd.fds_bits[8] = 0;
      errorfd.fds_bits[9] = 0;
      errorfd.fds_bits[6] = 0;
      errorfd.fds_bits[7] = 0;
      errorfd.fds_bits[4] = 0;
      errorfd.fds_bits[5] = 0;
      errorfd.fds_bits[2] = 0;
      errorfd.fds_bits[3] = 0;
      errorfd.fds_bits[0] = 0;
      errorfd.fds_bits[1] = 0;
      local_178.tv_sec = 2;
      local_178.tv_usec = 0;
      for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
        readfd.fds_bits[lVar6] = 0;
      }
      for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
        errorfd.fds_bits[lVar6] = 0;
      }
      iVar5 = (this->super_BaseSocketImpl).m_fSock;
      uVar7 = 1L << ((byte)iVar5 & 0x3f);
      readfd.fds_bits[iVar5 / 0x40] = readfd.fds_bits[iVar5 / 0x40] | uVar7;
      errorfd.fds_bits[iVar5 / 0x40] = errorfd.fds_bits[iVar5 / 0x40] | uVar7;
      iVar5 = select(iVar5 + 1,(fd_set *)&readfd,(fd_set *)0x0,(fd_set *)&errorfd,&local_178);
      if (0 < iVar5) {
        iVar5 = (this->super_BaseSocketImpl).m_fSock;
        if (((ulong)errorfd.fds_bits[iVar5 / 0x40] >> ((long)iVar5 % 0x40 & 0x3fU) & 1) != 0) {
          iLen = 4;
          getsockopt(iVar5,1,4,piVar9,&iLen);
          (this->super_BaseSocketImpl).m_iErrLoc = 5;
          bVar2 = (this->super_BaseSocketImpl).m_bStop;
          if (bVar2 == false &&
              (this->super_BaseSocketImpl).m_fErrorParam.super__Function_base._M_manager !=
              (_Manager_type)0x0) {
            std::function<void_(BaseSocket_*,_void_*)>::operator()
                      (local_1a8,(this->super_BaseSocketImpl).m_pBkRef,
                       (this->super_BaseSocketImpl).m_pvUserData);
          }
          else if ((this->super_BaseSocketImpl).m_fError.super__Function_base._M_manager !=
                   (_Manager_type)0x0 && bVar2 == false) {
            std::function<void_(BaseSocket_*)>::operator()
                      (local_1b0,(this->super_BaseSocketImpl).m_pBkRef);
          }
          goto LAB_00116c88;
        }
        if ((readfd.fds_bits[iVar5 / 0x40] & 1L << ((byte)((long)iVar5 % 0x40) & 0x3f)) != 0) {
          do {
            local_1b8 = piVar9;
            sVar8 = recv(iVar5,(void *)buf._M_t.
                                       super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                       super__Head_base<0UL,_char_*,_false>._M_head_impl,0xffff,0);
            uVar11 = (uint)sVar8;
            transferred = uVar11;
            if ((int)uVar11 < 1) {
              if (uVar11 == 0) {
                iVar5 = shutdown((this->super_BaseSocketImpl).m_fSock,0);
                if (iVar5 != 0) {
                  piVar9 = __errno_location();
                  (this->super_BaseSocketImpl).m_iError = *piVar9;
                  (this->super_BaseSocketImpl).m_iErrLoc = 6;
                }
                while (bReadCall == true) {
                  _iLen = (uchar *)0xa;
                  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                            ((duration<long,_std::ratio<1L,_1000L>_> *)&iLen);
                }
                pBVar4 = (this->super_BaseSocketImpl).m_pBkRef;
                if (pBVar4 == (BaseSocket *)0x0) {
                  pTVar10 = (TcpSocket *)0x0;
                }
                else {
                  pTVar10 = (TcpSocket *)
                            __dynamic_cast(pBVar4,&BaseSocket::typeinfo,&TcpSocket::typeinfo,0);
                }
                if (pTVar10 == (TcpSocket *)0x0 ||
                    (this->m_fBytesReceivedParam).super__Function_base._M_manager ==
                    (_Manager_type)0x0) {
                  bVar12 = true;
                  if ((this->m_fBytesReceived).super__Function_base._M_manager != (_Manager_type)0x0
                      && pTVar10 != (TcpSocket *)0x0) {
                    std::function<void_(TcpSocket_*)>::operator()(local_1a0,pTVar10);
                  }
                }
                else {
                  bVar12 = true;
                  std::function<void_(TcpSocket_*,_void_*)>::operator()
                            (local_198,pTVar10,(this->super_BaseSocketImpl).m_pvUserData);
                }
              }
              else {
                piVar9 = __errno_location();
                if (*piVar9 != 0xb) {
                  (this->super_BaseSocketImpl).m_iError = *piVar9;
                  (this->super_BaseSocketImpl).m_iErrLoc = 7;
                  bVar2 = (this->super_BaseSocketImpl).m_bStop;
                  if (bVar2 == false &&
                      (this->super_BaseSocketImpl).m_fErrorParam.super__Function_base._M_manager !=
                      (_Manager_type)0x0) {
                    std::function<void_(BaseSocket_*,_void_*)>::operator()
                              (local_1a8,(this->super_BaseSocketImpl).m_pBkRef,
                               (this->super_BaseSocketImpl).m_pvUserData);
                  }
                  else if ((this->super_BaseSocketImpl).m_fError.super__Function_base._M_manager !=
                           (_Manager_type)0x0 && bVar2 == false) {
                    std::function<void_(BaseSocket_*)>::operator()
                              (local_1b0,(this->super_BaseSocketImpl).m_pBkRef);
                  }
                }
              }
            }
            else {
              bZeroReceived = false;
              if (((this->m_fnSslDecode).super__Function_base._M_manager == (_Manager_type)0x0) ||
                 (iVar5 = std::function<int_(const_unsigned_char_*,_unsigned_long,_bool_&)>::
                          operator()(local_180,
                                     (uchar *)buf._M_t.
                                              super___uniq_ptr_impl<char,_std::default_delete<char[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>
                                              .super__Head_base<0UL,_char_*,_false>._M_head_impl,
                                     (ulong)(uVar11 & 0x7fffffff),&bZeroReceived), iVar5 == 0)) {
                if (BaseSocketImpl::s_fTrafficDebug.super__Function_base._M_manager !=
                    (_Manager_type)0x0) {
                  std::function<void_(unsigned_short,_const_char_*,_unsigned_long,_bool)>::
                  operator()(&BaseSocketImpl::s_fTrafficDebug,
                             (unsigned_short)(this->super_BaseSocketImpl).m_fSock,
                             (char *)buf._M_t.
                                     super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                                     super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                     super__Head_base<0UL,_char_*,_false>._M_head_impl,
                             (long)transferred,false);
                }
                __n = transferred;
                uVar7 = (ulong)transferred;
                __result.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                     (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
                     operator_new__(uVar7);
                memset((void *)__result.
                               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                               .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,uVar7);
                _iLen = (uchar *)__result.
                                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                 .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
                std::copy_n<char*,int,unsigned_char*>
                          ((char *)buf._M_t.
                                   super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                                   super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                   super__Head_base<0UL,_char_*,_false>._M_head_impl,__n,
                           (uchar *)__result.
                                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                    .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
                __mutex = local_188;
                std::mutex::lock((mutex *)&local_188->__data);
                std::
                deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                ::
                emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,int&>
                          (local_190,
                           (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                           &iLen,&transferred);
                LOCK();
                (this->m_atInBytes).super___atomic_base<unsigned_long>._M_i =
                     (this->m_atInBytes).super___atomic_base<unsigned_long>._M_i + (long)transferred
                ;
                UNLOCK();
                pthread_mutex_unlock(__mutex);
                std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                          ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                           &iLen);
                iVar5 = 0;
              }
              if ((((this->m_fBytesReceivedParam).super__Function_base._M_manager !=
                    (_Manager_type)0x0 ||
                    (this->m_fBytesReceived).super__Function_base._M_manager != (_Manager_type)0x0)
                  && (iVar5 != -1)) && ((this->super_BaseSocketImpl).m_bStop == false)) {
                std::mutex::lock(&mxNotify);
                if (bReadCall == false) {
                  bReadCall = true;
                  local_1c0._M_id._M_thread = (id)0;
                  _iLen = (uchar *)operator_new(0x20);
                  *(undefined ***)_iLen = &PTR___State_001457c8;
                  *(mutex **)((long)_iLen + 8) = &mxNotify;
                  *(TcpSocketImpl **)((long)_iLen + 0x10) = this;
                  *(bool **)((long)_iLen + 0x18) = &bReadCall;
                  std::thread::_M_start_thread
                            (&local_1c0,
                             (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                             &iLen,0);
                  if ((long *)_iLen != (long *)0x0) {
                    (**(code **)(*(long *)_iLen + 8))();
                  }
                  std::thread::detach();
                  std::thread::~thread(&local_1c0);
                }
                pthread_mutex_unlock((pthread_mutex_t *)&mxNotify);
              }
              if (bZeroReceived == true) {
                iVar5 = shutdown((this->super_BaseSocketImpl).m_fSock,0);
                if (iVar5 != 0) {
                  piVar9 = __errno_location();
                  (this->super_BaseSocketImpl).m_iError = *piVar9;
                  (this->super_BaseSocketImpl).m_iErrLoc = 0xe;
                }
                while (bReadCall == true) {
                  _iLen = (uchar *)0xa;
                  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                            ((duration<long,_std::ratio<1L,_1000L>_> *)&iLen);
                }
                pBVar4 = (this->super_BaseSocketImpl).m_pBkRef;
                if (pBVar4 == (BaseSocket *)0x0) {
                  pTVar10 = (TcpSocket *)0x0;
                }
                else {
                  pTVar10 = (TcpSocket *)
                            __dynamic_cast(pBVar4,&BaseSocket::typeinfo,&TcpSocket::typeinfo,0);
                }
                if (pTVar10 == (TcpSocket *)0x0 ||
                    (this->m_fBytesReceivedParam).super__Function_base._M_manager ==
                    (_Manager_type)0x0) {
                  bVar12 = true;
                  if ((this->m_fBytesReceived).super__Function_base._M_manager != (_Manager_type)0x0
                      && pTVar10 != (TcpSocket *)0x0) {
                    std::function<void_(TcpSocket_*)>::operator()(local_1a0,pTVar10);
                  }
                }
                else {
                  bVar12 = true;
                  std::function<void_(TcpSocket_*,_void_*)>::operator()
                            (local_198,pTVar10,(this->super_BaseSocketImpl).m_pvUserData);
                }
              }
            }
            iVar5 = (this->super_BaseSocketImpl).m_fSock;
            iVar3 = (this->super_BaseSocketImpl).m_iError;
            piVar9 = local_1b8;
          } while (((0 < (int)uVar11) && ((this->super_BaseSocketImpl).m_bStop == false)) &&
                  ((iVar5 != -1 && ((iVar3 == 0 && (!bVar12))))));
          if ((bVar12) || (((iVar3 != 0xb && (iVar3 != 0)) || (iVar5 == -1)))) goto LAB_00116c88;
        }
      }
      goto LAB_00116695;
    }
    readfd.fds_bits[0] = 1;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&readfd);
  } while( true );
}

Assistant:

void TcpSocketImpl::SelectThread()
{
    m_iShutDownState &= static_cast<uint8_t>(~1);

    bool bReadCall = false;
    mutex mxNotify;
    bool bSocketShutDown = false;
	auto buf = make_unique<char[]>(0x0000ffff);

    while (m_bStop == false)
    {
        if (m_atInBytes > 0x80000)  // More than 512 KB in the receive buffer
        {
            this_thread::sleep_for(chrono::milliseconds(1));
            continue;
        }

        fd_set readfd{}, errorfd{};
        struct timeval timeout{};

        timeout.tv_sec = 2;
        timeout.tv_usec = 0;
        FD_ZERO(&readfd);
        FD_ZERO(&errorfd);

        FD_SET(m_fSock, &readfd);
        FD_SET(m_fSock, &errorfd);

        if (::select(static_cast<int>(m_fSock + 1), &readfd, nullptr, &errorfd, &timeout) > 0)
        {
            if (FD_ISSET(m_fSock, &errorfd))
            {
                socklen_t iLen = sizeof(m_iError);
                getsockopt(m_fSock, SOL_SOCKET, SO_ERROR, reinterpret_cast<char*>(&m_iError), &iLen);
                m_iErrLoc = 5;
                if (m_fErrorParam && m_bStop == false)
                    m_fErrorParam(m_pBkRef, m_pvUserData);
                else if (m_fError && m_bStop == false)
                    m_fError(m_pBkRef);
                break;
            }

            if (FD_ISSET(m_fSock, &readfd))
            {
                do
                {
                    int32_t transferred = ::recv(m_fSock, &buf[0], 0x0000ffff, 0);

                    if (transferred <= 0)
                    {
                        if (transferred == 0)
                        {   // The connection was shutdown from the other side, there will be no more bytes to read on that connection
                            // We set the flag, so we don't read on the connection any more

                            if (::shutdown(m_fSock, SD_RECEIVE) != 0)
                            {
                                m_iError = WSAGetLastError();// OutputDebugString(L"Error shutdown socket\r\n");
                                m_iErrLoc = 6;
                            }
                            bSocketShutDown = true;

                            while (bReadCall == true)
                                this_thread::sleep_for(chrono::milliseconds(10));

                            TcpSocket* pTcpSocket = dynamic_cast<TcpSocket*>(m_pBkRef);
                            if (m_fBytesReceivedParam && pTcpSocket != nullptr)
                                m_fBytesReceivedParam(pTcpSocket, m_pvUserData);
                            else if (m_fBytesReceived && pTcpSocket != nullptr)
                                m_fBytesReceived(pTcpSocket);
                        }
                        else
                        {
                            const int iError = WSAGetLastError();
                            if (iError != WSAEWOULDBLOCK)
                            {
                                m_iError = iError;
                                m_iErrLoc = 7;
                                if (m_fErrorParam && m_bStop == false)
                                    m_fErrorParam(m_pBkRef, m_pvUserData);
                                else if (m_fError && m_bStop == false)
                                    m_fError(m_pBkRef);
                            }
                        }
                        break;
                    }
                    else
                    {
                        bool bZeroReceived = false;
                        int iRet = 0;
                        if (m_fnSslDecode == nullptr || (iRet = m_fnSslDecode(reinterpret_cast<const uint8_t*>(&buf[0]), transferred, bZeroReceived), iRet == 0))
                        {
                            if (s_fTrafficDebug != nullptr)
                                s_fTrafficDebug(static_cast<uint16_t>(m_fSock), &buf[0], transferred, false);

                            auto tmp = make_unique<uint8_t[]>(transferred);
                            copy_n(&buf[0], transferred, &tmp[0]);
                            lock_guard<mutex> lock(m_mxInDeque);
                            m_quInData.emplace_back(move(tmp), transferred);
                            m_atInBytes += transferred;
                        }

                        if ((m_fBytesReceived || m_fBytesReceivedParam) && m_bStop == false && iRet != -1)
                        {
                            lock_guard<mutex> lock(mxNotify);
                            if (bReadCall == false)
                            {
                                bReadCall = true;
                                thread([&]()
                                {
                                    mxNotify.lock();
                                    m_mxInDeque.lock();
                                    while (m_atInBytes > 0 && m_bStop == false)
                                    {
                                        m_mxInDeque.unlock();
                                        mxNotify.unlock();
                                        TcpSocket* pTcpSocket = dynamic_cast<TcpSocket*>(m_pBkRef);
                                        if (m_fBytesReceivedParam != nullptr && pTcpSocket != nullptr)
                                            m_fBytesReceivedParam(pTcpSocket, m_pvUserData);
                                        else if (m_fBytesReceived != nullptr && pTcpSocket != nullptr)
                                            m_fBytesReceived(pTcpSocket);
                                        mxNotify.lock();
                                        m_mxInDeque.lock();
                                    }
                                    bReadCall = false;
                                    m_mxInDeque.unlock();
                                    mxNotify.unlock();
                                }).detach();
                            }
                        }

                        if (bZeroReceived == true)
                        {
                            if (::shutdown(m_fSock, SD_RECEIVE) != 0)
                            {
                                m_iError = WSAGetLastError();// OutputDebugString(L"Error shutdown socket\r\n");
                                m_iErrLoc = 14;
                            }
                            bSocketShutDown = true;

                            while (bReadCall == true)
                                this_thread::sleep_for(chrono::milliseconds(10));

                            TcpSocket* pTcpSocket = dynamic_cast<TcpSocket*>(m_pBkRef);
                            if (m_fBytesReceivedParam && pTcpSocket != nullptr)
                                m_fBytesReceivedParam(pTcpSocket, m_pvUserData);
                            else if (m_fBytesReceived && pTcpSocket != nullptr)
                                m_fBytesReceived(pTcpSocket);
                        }
                    }
                } while (m_bStop == false && m_fSock != INVALID_SOCKET && m_iError == 0 && bSocketShutDown == false);

                if (bSocketShutDown == true || (m_iError != 0 && m_iError != WSAEWOULDBLOCK) || m_fSock == INVALID_SOCKET)
                    break;
            }
        }// if select
    }//while

    // if we are here, bStop is set,or m_iShutDownState has bit 1 set, or we have an error

    if (bSocketShutDown == false && m_iError == 0 && m_fSock != INVALID_SOCKET)
    {
        if (::shutdown(m_fSock, SD_RECEIVE) != 0)
        {
            m_iError = WSAGetLastError();// OutputDebugString(L"Error RECEIVE shutdown socket\r\n");
            m_iErrLoc = 8;
        }
    }

    while (bReadCall == true)
        this_thread::sleep_for(chrono::milliseconds(10));

    mxNotify.lock();    // in rare cases, bReadCall was set to false, and the task switch
    mxNotify.unlock();  // ended that thread before the lambda thread released mxNotify -> crash

    m_iShutDownState |= 1;

    unsigned char cExpected = 7;
    if (m_iShutDownState.compare_exchange_strong(cExpected, 15) == true)
    {
        if (m_fSock != INVALID_SOCKET)
        {
            ::closesocket(m_fSock);
            m_fSock = INVALID_SOCKET;
        }

        StartClosingCB();

        // if it is a auto-delete class we start the auto-delete thread now
        if (m_pRefServSocket != nullptr || m_bSelfDelete == true)    // Auto-delete, socket created from server socket
             Delete();// thread([&]() { delete this; }).detach();
    }
}